

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QString * __thiscall QGraphicsItem::toolTip(QGraphicsItem *this)

{
  long lVar1;
  long in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
            ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *)
             (in_RSI + 8));
  QGraphicsItemPrivate::extra
            ((QGraphicsItemPrivate *)in_stack_ffffffffffffffd8,(Extra)((ulong)in_RDI >> 0x20));
  ::QVariant::toString();
  ::QVariant::~QVariant((QVariant *)&stack0xffffffffffffffd8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QGraphicsItem::toolTip() const
{
    return d_ptr->extra(QGraphicsItemPrivate::ExtraToolTip).toString();
}